

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::TiledOutputFile::TiledOutputFile(TiledOutputFile *this,OutputPartData *part)

{
  bool bVar1;
  ArgExc *this_00;
  _func_int **pp_Var2;
  long in_RSI;
  GenericOutputFile *in_RDI;
  stringstream _iex_replace_s;
  BaseExc *e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe7c;
  Data *in_stack_fffffffffffffe80;
  Header *in_stack_fffffffffffffea8;
  TiledOutputFile *in_stack_fffffffffffffeb0;
  
  GenericOutputFile::GenericOutputFile(in_RDI);
  in_RDI->_vptr_GenericOutputFile = (_func_int **)&PTR__TiledOutputFile_002ad458;
  *(undefined1 *)&in_RDI[3]._vptr_GenericOutputFile = 0;
  Header::type_abi_cxx11_((Header *)0x240ccd);
  bVar1 = std::operator!=(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  if (!bVar1) {
    in_RDI[2]._vptr_GenericOutputFile = *(_func_int ***)(in_RSI + 0x58);
    pp_Var2 = (_func_int **)operator_new(0x178);
    Data::Data(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
    in_RDI[1]._vptr_GenericOutputFile = pp_Var2;
    *(byte *)((long)in_RDI[1]._vptr_GenericOutputFile + 0x3c) = *(byte *)(in_RSI + 0x50) & 1;
    initialize(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    *(undefined4 *)(in_RDI[1]._vptr_GenericOutputFile + 0x2e) = *(undefined4 *)(in_RSI + 0x4c);
    in_RDI[1]._vptr_GenericOutputFile[0x25] = *(_func_int **)(in_RSI + 0x38);
    in_RDI[1]._vptr_GenericOutputFile[0x10] = *(_func_int **)(in_RSI + 0x40);
    return;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,"Can\'t build a TiledOutputFile from a type-mismatched part.");
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

TiledOutputFile::TiledOutputFile (const OutputPartData* part)
    : _deleteStream (false)
{
    try
    {
        if (part->header.type () != TILEDIMAGE)
            throw IEX_NAMESPACE::ArgExc (
                "Can't build a TiledOutputFile from a type-mismatched part.");

        _streamData      = part->mutex;
        _data            = new Data (part->numThreads);
        _data->multipart = part->multipart;
        initialize (part->header);
        _data->partNumber          = part->partNumber;
        _data->tileOffsetsPosition = part->chunkOffsetTablePosition;
        _data->previewPosition     = part->previewPosition;
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        delete _data;

        REPLACE_EXC (
            e,
            "Cannot initialize output part "
            "\"" << part->partNumber
                 << "\". " << e.what ());
        throw;
    }
    catch (...)
    {
        delete _data;
        throw;
    }
}